

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall wabt::WastParser::ParseElemExprVarListOpt(WastParser *this,ExprListVector *out_list)

{
  _func_int ***ppp_Var1;
  bool bVar2;
  Expr *pEVar3;
  intrusive_list<wabt::Expr> *piVar4;
  pointer piVar5;
  pointer piVar6;
  Var var;
  intrusive_list<wabt::Expr> local_d8;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_c0);
  local_d8.first_ = (Expr *)0x0;
  local_d8.last_ = (Expr *)0x0;
  local_d8.size_ = 0;
  Var::Var(&local_78);
  bVar2 = ParseVarOpt(this,&local_c0,&local_78);
  Var::~Var(&local_78);
  if (bVar2) {
    do {
      pEVar3 = (Expr *)operator_new(0x88);
      (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar3->loc).filename._M_len = 0;
      (pEVar3->loc).filename._M_str = (char *)0x0;
      *(undefined8 *)((long)&(pEVar3->loc).filename._M_str + 4) = 0;
      *(undefined8 *)((long)&(pEVar3->loc).field_1.field_1.offset + 4) = 0;
      pEVar3->type_ = RefFunc;
      pEVar3->_vptr_Expr = (_func_int **)&PTR__VarExpr_001905e0;
      Var::Var((Var *)(pEVar3 + 1),&local_c0);
      if (((pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
         ((pEVar3->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
        __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                      ,0x1bd,
                      "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                     );
      }
      piVar4 = &local_d8;
      if (local_d8.last_ != (Expr *)0x0) {
        (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = local_d8.last_;
        piVar4 = (intrusive_list<wabt::Expr> *)
                 &(local_d8.last_)->super_intrusive_list_base<wabt::Expr>;
      }
      ((intrusive_list_base<wabt::Expr> *)piVar4)->next_ = pEVar3;
      local_d8.size_ = local_d8.size_ + 1;
      local_d8.last_ = pEVar3;
      std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
      ::emplace_back<wabt::intrusive_list<wabt::Expr>>
                ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                  *)out_list,&local_d8);
      Var::Var(&local_78);
      bVar2 = ParseVarOpt(this,&local_c0,&local_78);
      Var::~Var(&local_78);
    } while (bVar2);
    piVar6 = (out_list->
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (out_list->
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pEVar3 = local_d8.first_;
    while (pEVar3 != (Expr *)0x0) {
      ppp_Var1 = &pEVar3->_vptr_Expr;
      pEVar3 = (pEVar3->super_intrusive_list_base<wabt::Expr>).next_;
      (*(*ppp_Var1)[1])();
    }
  }
  else {
    piVar6 = (out_list->
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (out_list->
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  Var::~Var(&local_c0);
  return piVar6 != piVar5;
}

Assistant:

bool WastParser::ParseElemExprVarListOpt(ExprListVector* out_list) {
  WABT_TRACE(ParseElemExprVarListOpt);
  Var var;
  ExprList init_expr;
  while (ParseVarOpt(&var)) {
    init_expr.push_back(std::make_unique<RefFuncExpr>(var));
    out_list->push_back(std::move(init_expr));
  }
  return !out_list->empty();
}